

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeDelete(BtCursor *pCur,u8 flags)

{
  char cVar1;
  u8 uVar2;
  u8 uVar3;
  ushort uVar4;
  ushort uVar5;
  MemPage *pPage;
  u8 *puVar6;
  MemPage *pMVar7;
  char cVar8;
  u16 uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  BtCursor *pBVar13;
  int local_74;
  ulong local_70;
  MemPage *local_68;
  BtShared *local_60;
  Pgno local_58;
  undefined4 local_54;
  ulong local_50;
  CellInfo info;
  
  local_68 = (MemPage *)pCur->pBtree;
  local_60 = *(BtShared **)&local_68->leaf;
  cVar1 = pCur->iPage;
  uVar12 = (ulong)pCur->aiIdx[cVar1];
  pPage = pCur->apPage[cVar1];
  uVar4 = pPage->maskPage;
  uVar2 = pPage->aCellIdx[uVar12 * 2];
  uVar3 = pPage->aCellIdx[uVar12 * 2 + 1];
  puVar6 = pPage->aData;
  local_54 = (undefined4)CONCAT71((int7)((ulong)pCur >> 8),1);
  if ((flags & 2) != 0) {
    if (pPage->leaf != '\0') {
      uVar5 = pPage->nFree;
      local_70 = uVar12;
      uVar9 = cellSizePtr(pPage,puVar6 + (CONCAT11(uVar2,uVar3) & uVar4));
      local_54 = 0;
      uVar12 = local_70;
      if ((uint)uVar5 + (uint)uVar9 + 2 <= (local_60->usableSize * 2) / 3) goto LAB_00131291;
    }
    pBVar13 = pCur;
    local_74 = saveCursorKey(pCur);
    local_54 = (undefined4)CONCAT71((int7)((ulong)pBVar13 >> 8),1);
    if (local_74 != 0) {
      return local_74;
    }
  }
LAB_00131291:
  if (((pPage->leaf != '\0') || (iVar10 = sqlite3BtreePrevious(pCur,(int *)&info), iVar10 == 0)) &&
     (((pCur->curFlags & 0x20) == 0 ||
      (iVar10 = saveAllCursors(local_60,pCur->pgnoRoot,pCur), iVar10 == 0)))) {
    if (pCur->pKeyInfo == (KeyInfo *)0x0) {
      invalidateIncrblobCursors((Btree *)local_68,(pCur->info).nKey,0);
    }
    iVar10 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar10 == 0) {
      local_70 = uVar12;
      local_74 = clearCell(pPage,puVar6 + (CONCAT11(uVar2,uVar3) & uVar4),&info);
      uVar12 = local_70;
      dropCell(pPage,(int)local_70,(uint)info.nSize,&local_74);
      iVar10 = local_74;
      if (local_74 == 0) {
        if (pPage->leaf == '\0') {
          pMVar7 = pCur->apPage[pCur->iPage];
          uVar11 = (uint)(CONCAT11(pMVar7->aCellIdx[(ulong)pMVar7->nCell * 2 + -2],
                                   pMVar7->aCellIdx[(ulong)pMVar7->nCell * 2 + -1]) &
                         pMVar7->maskPage);
          if (uVar11 < 4) {
            iVar10 = sqlite3CorruptError(0x10645);
            return iVar10;
          }
          local_58 = pCur->apPage[(long)cVar1 + 1]->pgno;
          puVar6 = pMVar7->aData;
          local_68 = pMVar7;
          uVar9 = (*pMVar7->xCellSize)(pMVar7,puVar6 + uVar11);
          local_50 = (ulong)uVar9;
          local_60 = (BtShared *)local_60->pTmpSpace;
          local_74 = sqlite3PagerWrite(local_68->pDbPage);
          if (local_74 == 0) {
            insertCell(pPage,(int)local_70,puVar6 + uVar11 + -4,(int)local_50 + 4,(u8 *)local_60,
                       local_58,&local_74);
          }
          dropCell(local_68,local_68->nCell - 1,(int)local_50,&local_74);
          uVar12 = local_70;
          if (local_74 != 0) {
            return local_74;
          }
        }
        iVar10 = balance(pCur);
        if (iVar10 == 0) {
          cVar8 = pCur->iPage;
          if (cVar1 < cVar8) {
            while (cVar1 < cVar8) {
              pCur->iPage = cVar8 + -1;
              releasePage(pCur->apPage[cVar8]);
              cVar8 = pCur->iPage;
            }
            iVar10 = balance(pCur);
            if (iVar10 != 0) {
              return iVar10;
            }
          }
          if ((char)local_54 == '\0') {
            pCur->eState = '\x02';
            uVar4 = pPage->nCell;
            if ((ushort)uVar12 < uVar4) {
              pCur->skipNext = 1;
            }
            else {
              pCur->skipNext = -1;
              pCur->aiIdx[cVar1] = uVar4 - 1;
            }
            iVar10 = 0;
          }
          else {
            iVar10 = moveToRoot(pCur);
            if ((flags & 2) != 0) {
              pCur->eState = '\x03';
            }
          }
        }
      }
    }
  }
  return iVar10;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDelete(BtCursor *pCur, u8 flags){
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;              
  int rc;                              /* Return code */
  MemPage *pPage;                      /* Page to delete cell from */
  unsigned char *pCell;                /* Pointer to cell to delete */
  int iCellIdx;                        /* Index of cell to delete */
  int iCellDepth;                      /* Depth of node containing pCell */ 
  CellInfo info;                       /* Size of the cell being deleted */
  int bSkipnext = 0;                   /* Leaf cursor in SKIPNEXT state */
  u8 bPreserve = flags & BTREE_SAVEPOSITION;  /* Keep cursor valid */

  assert( cursorOwnsBtShared(pCur) );
  assert( pBt->inTransaction==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( pCur->curFlags & BTCF_WriteFlag );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );
  assert( !hasReadConflicts(p, pCur->pgnoRoot) );
  assert( pCur->aiIdx[pCur->iPage]<pCur->apPage[pCur->iPage]->nCell );
  assert( pCur->eState==CURSOR_VALID );
  assert( (flags & ~(BTREE_SAVEPOSITION | BTREE_AUXDELETE))==0 );

  iCellDepth = pCur->iPage;
  iCellIdx = pCur->aiIdx[iCellDepth];
  pPage = pCur->apPage[iCellDepth];
  pCell = findCell(pPage, iCellIdx);

  /* If the bPreserve flag is set to true, then the cursor position must
  ** be preserved following this delete operation. If the current delete
  ** will cause a b-tree rebalance, then this is done by saving the cursor
  ** key and leaving the cursor in CURSOR_REQUIRESEEK state before 
  ** returning. 
  **
  ** Or, if the current delete will not cause a rebalance, then the cursor
  ** will be left in CURSOR_SKIPNEXT state pointing to the entry immediately
  ** before or after the deleted entry. In this case set bSkipnext to true.  */
  if( bPreserve ){
    if( !pPage->leaf 
     || (pPage->nFree+cellSizePtr(pPage,pCell)+2)>(int)(pBt->usableSize*2/3)
    ){
      /* A b-tree rebalance will be required after deleting this entry.
      ** Save the cursor key.  */
      rc = saveCursorKey(pCur);
      if( rc ) return rc;
    }else{
      bSkipnext = 1;
    }
  }

  /* If the page containing the entry to delete is not a leaf page, move
  ** the cursor to the largest entry in the tree that is smaller than
  ** the entry being deleted. This cell will replace the cell being deleted
  ** from the internal node. The 'previous' entry is used for this instead
  ** of the 'next' entry, as the previous entry is always a part of the
  ** sub-tree headed by the child page of the cell being deleted. This makes
  ** balancing the tree following the delete operation easier.  */
  if( !pPage->leaf ){
    int notUsed = 0;
    rc = sqlite3BtreePrevious(pCur, &notUsed);
    if( rc ) return rc;
  }

  /* Save the positions of any other cursors open on this table before
  ** making any modifications.  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  /* If this is a delete operation to remove a row from a table b-tree,
  ** invalidate any incrblob cursors open on the row being deleted.  */
  if( pCur->pKeyInfo==0 ){
    invalidateIncrblobCursors(p, pCur->info.nKey, 0);
  }

  /* Make the page containing the entry to be deleted writable. Then free any
  ** overflow pages associated with the entry and finally remove the cell
  ** itself from within the page.  */
  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc ) return rc;
  rc = clearCell(pPage, pCell, &info);
  dropCell(pPage, iCellIdx, info.nSize, &rc);
  if( rc ) return rc;

  /* If the cell deleted was not located on a leaf page, then the cursor
  ** is currently pointing to the largest entry in the sub-tree headed
  ** by the child-page of the cell that was just deleted from an internal
  ** node. The cell from the leaf node needs to be moved to the internal
  ** node to replace the deleted cell.  */
  if( !pPage->leaf ){
    MemPage *pLeaf = pCur->apPage[pCur->iPage];
    int nCell;
    Pgno n = pCur->apPage[iCellDepth+1]->pgno;
    unsigned char *pTmp;

    pCell = findCell(pLeaf, pLeaf->nCell-1);
    if( pCell<&pLeaf->aData[4] ) return SQLITE_CORRUPT_BKPT;
    nCell = pLeaf->xCellSize(pLeaf, pCell);
    assert( MX_CELL_SIZE(pBt) >= nCell );
    pTmp = pBt->pTmpSpace;
    assert( pTmp!=0 );
    rc = sqlite3PagerWrite(pLeaf->pDbPage);
    if( rc==SQLITE_OK ){
      insertCell(pPage, iCellIdx, pCell-4, nCell+4, pTmp, n, &rc);
    }
    dropCell(pLeaf, pLeaf->nCell-1, nCell, &rc);
    if( rc ) return rc;
  }

  /* Balance the tree. If the entry deleted was located on a leaf page,
  ** then the cursor still points to that page. In this case the first
  ** call to balance() repairs the tree, and the if(...) condition is
  ** never true.
  **
  ** Otherwise, if the entry deleted was on an internal node page, then
  ** pCur is pointing to the leaf page from which a cell was removed to
  ** replace the cell deleted from the internal node. This is slightly
  ** tricky as the leaf node may be underfull, and the internal node may
  ** be either under or overfull. In this case run the balancing algorithm
  ** on the leaf node first. If the balance proceeds far enough up the
  ** tree that we can be sure that any problem in the internal node has
  ** been corrected, so be it. Otherwise, after balancing the leaf node,
  ** walk the cursor up the tree to the internal node and balance it as 
  ** well.  */
  rc = balance(pCur);
  if( rc==SQLITE_OK && pCur->iPage>iCellDepth ){
    while( pCur->iPage>iCellDepth ){
      releasePage(pCur->apPage[pCur->iPage--]);
    }
    rc = balance(pCur);
  }

  if( rc==SQLITE_OK ){
    if( bSkipnext ){
      assert( bPreserve && (pCur->iPage==iCellDepth || CORRUPT_DB) );
      assert( pPage==pCur->apPage[pCur->iPage] || CORRUPT_DB );
      assert( (pPage->nCell>0 || CORRUPT_DB) && iCellIdx<=pPage->nCell );
      pCur->eState = CURSOR_SKIPNEXT;
      if( iCellIdx>=pPage->nCell ){
        pCur->skipNext = -1;
        pCur->aiIdx[iCellDepth] = pPage->nCell-1;
      }else{
        pCur->skipNext = 1;
      }
    }else{
      rc = moveToRoot(pCur);
      if( bPreserve ){
        pCur->eState = CURSOR_REQUIRESEEK;
      }
    }
  }
  return rc;
}